

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

int SaveEnv(void)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  ulong uVar3;
  interval *piVar4;
  long lVar5;
  char line [1024];
  
  memset(line,0,0x400);
  __stream = fopen("env.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("Error saving configuration file.");
  }
  else {
    __stream_00 = fopen("~env.txt","w");
    if (__stream_00 != (FILE *)0x0) {
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",
                      ((1.5707963267948966 - angle_env) * 180.0) / 3.141592653589793);
      if (iVar1 < 0) {
        puts("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : lat_env.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",lat_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : lat_env.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : long_env.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",long_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : long_env.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : alt_env.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",alt_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : alt_env.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : MagneticDeclination.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",MagneticDeclination);
      if (iVar1 < 0) {
        puts("Error writing parameter : MagneticDeclination.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : AirPressure.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",AirPressure);
      if (iVar1 < 0) {
        puts("Error writing parameter : AirPressure.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : WaterVelocityOfSound.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",WaterVelocityOfSound);
      if (iVar1 < 0) {
        puts("Error writing parameter : WaterVelocityOfSound.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : WaterFloorAltitude.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",WaterFloorAltitude);
      if (iVar1 < 0) {
        puts("Error writing parameter : WaterFloorAltitude.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : (int)circles_r.size().");
      }
      iVar1 = fprintf(__stream_00,"%d\n",
                      (ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar1 < 0) {
        puts("Error writing parameter : (int)circles_r.size().");
      }
      for (lVar5 = 0;
          uVar3 = (long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
          pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400),
          lVar5 < (int)(uVar3 >> 3); lVar5 = lVar5 + 1) {
        if (pcVar2 == (char *)0x0) {
          puts("Invalid parameter : circles.");
        }
        iVar1 = fprintf(__stream_00,"%.10g %.10g %.10g\n",
                        circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5],
                        circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5],
                        circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5]);
        if (iVar1 < 0) {
          puts("Error writing parameter : circles.");
        }
      }
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : (int)walls_xa.size().");
      }
      iVar1 = fprintf(__stream_00,"%d\n",
                      (ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar1 < 0) {
        puts("Error writing parameter : (int)walls_xa.size().");
      }
      for (lVar5 = 0;
          uVar3 = (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
          pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400),
          lVar5 < (int)(uVar3 >> 3); lVar5 = lVar5 + 1) {
        if (pcVar2 == (char *)0x0) {
          puts("Invalid parameter : walls.");
        }
        iVar1 = fprintf(__stream_00,"%.10g %.10g %.10g %.10g\n",
                        walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5],
                        walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5],
                        walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5],
                        walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5]);
        if (iVar1 < 0) {
          puts("Error writing parameter : walls.");
        }
      }
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[0].inf.");
      }
      piVar4 = box::operator[](&box_env,0);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar4->inf);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[0].inf.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[0].sup.");
      }
      piVar4 = box::operator[](&box_env,0);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar4->sup);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[0].sup.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[1].inf.");
      }
      piVar4 = box::operator[](&box_env,1);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar4->inf);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[1].inf.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[1].sup.");
      }
      piVar4 = box::operator[](&box_env,1);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar4->sup);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[1].sup.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMin.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMin.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMax.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMax.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMin.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMin.");
      }
      pcVar2 = fgetscopy3((FILE *)__stream,(FILE *)__stream_00,line,0x400);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMax.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMax.");
      }
      iVar1 = fclose(__stream_00);
      if (iVar1 != 0) {
        puts("Error saving configuration file.");
        fclose(__stream);
        return 1;
      }
      iVar1 = fclose(__stream);
      if (((iVar1 == 0) && (iVar1 = remove("env.txt"), iVar1 == 0)) &&
         (iVar1 = rename("~env.txt","env.txt"), iVar1 == 0)) {
        return 0;
      }
      puts("Error saving configuration file.");
      return 1;
    }
    puts("Error saving configuration file.");
    fclose(__stream);
  }
  return 1;
}

Assistant:

inline int SaveEnv(void)
{
	FILE* filein = NULL;
	FILE* fileout = NULL;
	char line[1024];
	int i = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	filein = fopen("env.txt", "r");
	if (filein == NULL)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	fileout = fopen("~env.txt", "w");
	if (fileout == NULL)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");
	if (fprintf(fileout, "%.10g\n", (M_PI/2.0-angle_env)*180.0/M_PI) < 0) printf("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : lat_env.\n");
	if (fprintf(fileout, "%.10g\n", lat_env) < 0) printf("Error writing parameter : lat_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : long_env.\n");
	if (fprintf(fileout, "%.10g\n", long_env) < 0) printf("Error writing parameter : long_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : alt_env.\n");
	if (fprintf(fileout, "%.10g\n", alt_env) < 0) printf("Error writing parameter : alt_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : MagneticDeclination.\n");
	if (fprintf(fileout, "%.10g\n", MagneticDeclination) < 0) printf("Error writing parameter : MagneticDeclination.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : AirPressure.\n");
	if (fprintf(fileout, "%.10g\n", AirPressure) < 0) printf("Error writing parameter : AirPressure.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterVelocityOfSound.\n");
	if (fprintf(fileout, "%.10g\n", WaterVelocityOfSound) < 0) printf("Error writing parameter : WaterVelocityOfSound.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterFloorAltitude.\n");
	if (fprintf(fileout, "%.10g\n", WaterFloorAltitude) < 0) printf("Error writing parameter : WaterFloorAltitude.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)circles_r.size().\n");
	if (fprintf(fileout, "%d\n", (int)circles_r.size()) < 0) printf("Error writing parameter : (int)circles_r.size().\n");
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : circles.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g\n", circles_x[i], circles_y[i], circles_r[i]) < 0) printf("Error writing parameter : circles.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)walls_xa.size().\n");
	if (fprintf(fileout, "%d\n", (int)walls_xa.size()) < 0) printf("Error writing parameter : (int)walls_xa.size().\n");
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : walls.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g %.10g\n", walls_xa[i], walls_ya[i], walls_xb[i], walls_yb[i]) < 0) printf("Error writing parameter : walls.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].inf) < 0) printf("Error writing parameter : box_env[0].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].sup) < 0) printf("Error writing parameter : box_env[0].sup.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].inf) < 0) printf("Error writing parameter : box_env[1].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].sup) < 0) printf("Error writing parameter : box_env[1].sup.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");

	if (fclose(fileout) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}
	if (fclose(filein) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	if (remove("env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	if (rename("~env.txt", "env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}